

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O1

void __thiscall
IO::Thermo::setUpperTemperatureCoefficients
          (Thermo *this,double ah1,double ah2,double ah3,double ah4,double ah5,double ah6,double ah7
          )

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  iterator iVar2;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  pdVar1 = (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  this_00 = &this->ah_;
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = ah7;
  local_40 = ah6;
  local_38 = ah5;
  local_30 = ah4;
  local_28 = ah3;
  local_20 = ah2;
  local_18 = ah1;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = ah1;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_20);
  }
  else {
    *iVar2._M_current = local_20;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_30);
  }
  else {
    *iVar2._M_current = local_30;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = local_38;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_48);
  }
  else {
    *iVar2._M_current = local_48;
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void IO::Thermo::setUpperTemperatureCoefficients(
        double ah1, double ah2, double ah3,
        double ah4, double ah5, double ah6,
        double ah7) {
    ah_.clear();
    ah_.push_back(ah1);
    ah_.push_back(ah2);
    ah_.push_back(ah3);
    ah_.push_back(ah4);
    ah_.push_back(ah5);
    ah_.push_back(ah6);
    ah_.push_back(ah7);
}